

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::count(QStringView haystack,QRegularExpression *re)

{
  QStringView subjectView;
  bool bVar1;
  QRegularExpression *this;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype index;
  qsizetype count;
  QRegularExpressionMatch match;
  MatchOption in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QStringView *in_stack_ffffffffffffff28;
  bool local_c9;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar2;
  long local_80;
  long local_78;
  long local_58;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  undefined1 local_18 [8];
  storage_type_conflict *psStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (undefined1  [8])in_RDI;
  psStack_10 = in_RSI;
  bVar1 = QRegularExpression::isValid
                    ((QRegularExpression *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    local_78 = 0;
    local_80 = -1;
    this = (QRegularExpression *)QStringView::size((QStringView *)local_18);
    while (local_80 <= (long)((long)&this[-1].d.d.ptr + 7)) {
      psVar4 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      psVar3 = psStack_10;
      matchOptions.i = local_18._4_4_;
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      subjectView.m_data = psVar4;
      subjectView.m_size = (qsizetype)psVar3;
      QRegularExpression::matchView
                (this,subjectView,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (MatchType)((ulong)in_stack_ffffffffffffff68 >> 0x20),(MatchOptions)matchOptions.i)
      ;
      bVar1 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x510278);
      if (bVar1) {
        local_78 = local_78 + 1;
        local_80 = QRegularExpressionMatch::capturedStart
                             ((QRegularExpressionMatch *)in_stack_ffffffffffffff28,
                              in_stack_ffffffffffffff24);
        local_c9 = false;
        if (local_80 < (long)this) {
          QStringView::operator[]
                    (in_stack_ffffffffffffff28,
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          local_c9 = QChar::isHighSurrogate((QChar *)0x51032e);
        }
        if (local_c9 != false) {
          local_80 = local_80 + 1;
        }
        iVar2 = 0;
      }
      else {
        iVar2 = 3;
      }
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x51035f);
      if (iVar2 != 0) break;
      in_stack_ffffffffffffff74 = 0;
    }
    local_58 = local_78;
  }
  else {
    QRegularExpression::pattern((QRegularExpression *)in_stack_ffffffffffffff28);
    qtWarnAboutInvalidRegularExpression
              ((QString *)in_stack_ffffffffffffff28,
               (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QString::~QString((QString *)0x51016f);
    local_58 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, const QRegularExpression &re)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::count");
        return 0;
    }
    qsizetype count = 0;
    qsizetype index = -1;
    qsizetype len = haystack.size();
    while (index <= len - 1) {
        QRegularExpressionMatch match = re.matchView(haystack, index + 1);
        if (!match.hasMatch())
            break;
        count++;

        // Search again, from the next character after the beginning of this
        // capture. If the capture starts with a surrogate pair, both together
        // count as "one character".
        index = match.capturedStart();
        if (index < len && haystack[index].isHighSurrogate())
            ++index;
    }
    return count;
}